

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

bool test_Player_Constructor(void)

{
  bool bVar1;
  int iVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  DiceRoller *this;
  Player *this_00;
  Hand *this_01;
  Player *player1;
  bool success;
  int playerId;
  DiceRoller *diceRoller;
  Deck deck;
  Hand *cards;
  Country *pCountry3;
  Country *pCountry2;
  Country *pCountry1;
  string local_120;
  undefined1 local_100 [8];
  Country country3;
  string local_c8;
  undefined1 local_a8 [8];
  Country country2;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  Country country1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries1;
  
  pvVar3 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(pvVar3);
  country1.pAdjCountries = pvVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"country1",&local_61);
  Map::Country::Country((Country *)local_40,0,&local_60,0);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"country2",(allocator<char> *)((long)&country3.pAdjCountries + 7));
  Map::Country::Country((Country *)local_a8,1,&local_c8,0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&country3.pAdjCountries + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"country3",(allocator<char> *)((long)&pCountry1 + 7));
  Map::Country::Country((Country *)local_100,3,&local_120,1);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pCountry1 + 7));
  pCountry2 = (Country *)local_40;
  pCountry3 = (Country *)local_a8;
  cards = (Hand *)local_100;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (country1.pAdjCountries,&pCountry2);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (country1.pAdjCountries,&pCountry3);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (country1.pAdjCountries,(value_type *)&cards);
  pvVar4 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(8);
  Hand::Hand((Hand *)pvVar4);
  deck.discardPointer = pvVar4;
  Deck::Deck((Deck *)&diceRoller,3);
  Deck::createDeck((Deck *)&diceRoller);
  Deck::draw((Deck *)&diceRoller,(Hand *)deck.discardPointer);
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  player1._3_1_ = true;
  this_00 = (Player *)operator_new(0x38);
  Player::Player(this_00,country1.pAdjCountries,(Hand *)deck.discardPointer,this,1);
  pvVar3 = Player::getOwnedCountries(this_00);
  bVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::empty(pvVar3);
  if (!bVar1) {
    this_01 = Player::getCards(this_00);
    pvVar4 = Hand::getHand(this_01);
    bVar1 = std::vector<CardType,_std::allocator<CardType>_>::empty(pvVar4);
    if (!bVar1) {
      iVar2 = Player::getPlayerId(this_00);
      if (iVar2 == 1) goto LAB_00109fa3;
    }
  }
  player1._3_1_ = false;
LAB_00109fa3:
  if (this_00 != (Player *)0x0) {
    Player::~Player(this_00);
    operator_delete(this_00,0x38);
  }
  Deck::~Deck((Deck *)&diceRoller);
  Map::Country::~Country((Country *)local_100);
  Map::Country::~Country((Country *)local_a8);
  Map::Country::~Country((Country *)local_40);
  return player1._3_1_;
}

Assistant:

bool test_Player_Constructor() {

    // Arrange
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    Map::Country country1 = Map::Country(0, "country1", 0);
    Map::Country country2 = Map::Country(1, "country2", 0);
    Map::Country country3 = Map::Country(3, "country3", 1);
    Map::Country* pCountry1 = &country1;
    Map::Country* pCountry2 = &country2;
    Map::Country* pCountry3 = &country3;
    ownedCountries1->push_back(pCountry1);
    ownedCountries1->push_back(pCountry2);
    ownedCountries1->push_back(pCountry3);
    auto* cards = new Hand();
    Deck deck = Deck(3);
    deck.createDeck();
    deck.draw(*cards);
    auto* diceRoller = new DiceRoller();
    const int playerId = 1;
    bool success = true;

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, playerId);

    // Assert
    if (player1->getOwnedCountries()->empty() || player1->getCards()->getHand()->empty() ||
        playerId != player1->getPlayerId()) {
        success = false;
    }

    delete player1;
    return success;
}